

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTTBoard.cpp
# Opt level: O2

char __thiscall TTTBoard::PrintCell(TTTBoard *this,CellType cell)

{
  char cVar1;
  char cVar2;
  
  cVar1 = ' ';
  if (cell == OHS) {
    cVar1 = 'O';
  }
  cVar2 = 'X';
  if (cell != EXXES) {
    cVar2 = cVar1;
  }
  return cVar2;
}

Assistant:

char TTTBoard::PrintCell(CellType cell) const
{
    char cellchar = ' ';

    if(cell == EXXES)
        cellchar = 'X';
    else if (cell == OHS)
        cellchar = 'O';

    return cellchar;
}